

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall c4::yml::NodeRef::set_key(NodeRef *this,csubstr key)

{
  code *pcVar1;
  Location LVar2;
  undefined1 auVar3 [24];
  bool bVar4;
  char msg [43];
  char local_78 [56];
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  char *pcStack_28;
  undefined8 local_20;
  
  if (this->m_tree == (Tree *)0x0) {
    if ((s_error_flags & 1) != 0) {
      bVar4 = is_debugger_attached();
      if (bVar4) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
    }
    local_78[0] = '\0';
    local_78[1] = '\0';
    local_78[2] = '\0';
    local_78[3] = '\0';
    local_78[4] = '\0';
    local_78[5] = '\0';
    local_78[6] = '\0';
    local_78[7] = '\0';
    local_78[8] = '^';
    local_78[9] = 'R';
    local_78[10] = '\0';
    local_78[0xb] = '\0';
    local_78[0xc] = '\0';
    local_78[0xd] = '\0';
    local_78[0xe] = '\0';
    local_78[0xf] = '\0';
    local_78[0x10] = '\0';
    local_78[0x11] = '\0';
    local_78[0x12] = '\0';
    local_78[0x13] = '\0';
    local_78[0x14] = '\0';
    local_78[0x15] = '\0';
    local_78[0x16] = '\0';
    local_78[0x17] = '\0';
    local_78[0x18] = '\x1d';
    local_78[0x19] = -0x59;
    local_78[0x1a] = '$';
    local_78[0x1b] = '\0';
    local_78[0x1c] = '\0';
    local_78[0x1d] = '\0';
    local_78[0x1e] = '\0';
    local_78[0x1f] = '\0';
    local_78[0x20] = 'e';
    local_78[0x21] = '\0';
    local_78[0x22] = '\0';
    local_78[0x23] = '\0';
    local_78[0x24] = '\0';
    local_78[0x25] = '\0';
    local_78[0x26] = '\0';
    local_78[0x27] = '\0';
    (*(code *)PTR_error_impl_0029b798)
              ("check failed: m_tree != nullptr",0x1f,(anonymous_namespace)::s_default_callbacks);
  }
  if (((this->m_id == 0xffffffffffffffff) || ((this->m_seed).str != (char *)0x0)) ||
     ((this->m_seed).len != 0xffffffffffffffff)) {
    builtin_strncpy(local_78 + 0x20,"is_seed())",0xb);
    builtin_strncpy(local_78 + 0x10,"_id != NONE && !",0x10);
    builtin_strncpy(local_78,"check failed: (m",0x10);
    if ((s_error_flags & 1) != 0) {
      bVar4 = is_debugger_attached();
      if (bVar4) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
    }
    local_40 = 0;
    uStack_38 = 0x525e;
    local_30 = 0;
    pcStack_28 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_20 = 0x65;
    auVar3 = ZEXT1224(ZEXT412(0x525e) << 0x40);
    LVar2.name.str._0_4_ = 0x24a71d;
    LVar2.super_LineCol.offset = auVar3._0_8_;
    LVar2.super_LineCol.line = auVar3._8_8_;
    LVar2.super_LineCol.col = auVar3._16_8_;
    LVar2.name.str._4_4_ = 0;
    LVar2.name.len = 0x65;
    (*(this->m_tree->m_callbacks).m_error)
              (local_78,0x2b,LVar2,(this->m_tree->m_callbacks).m_user_data);
  }
  Tree::_set_key(this->m_tree,this->m_id,key,0);
  return;
}

Assistant:

void set_key(csubstr key) { _C4RV(); m_tree->_set_key(m_id, key); }